

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cc
# Opt level: O3

void __thiscall ArgParser::handleMoo(ArgParser *this,string *p)

{
  pointer pcVar1;
  long *plVar2;
  size_type *psVar3;
  long *local_80 [2];
  long local_70 [2];
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"got moo=","");
  local_80[0] = local_70;
  if (p->_M_string_length == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"(none)","");
  }
  else {
    pcVar1 = (p->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar1,pcVar1 + p->_M_string_length);
  }
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)local_40,(ulong)local_80[0]);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_60.field_2._M_allocated_capacity = *psVar3;
    local_60.field_2._8_8_ = plVar2[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar3;
    local_60._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_60._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  output(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void
ArgParser::handleMoo(std::string const& p)
{
    output(std::string("got moo=") + (p.empty() ? "(none)" : p));
}